

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

size_t __thiscall Memory::Recycler::TryMarkBigBlockList(Recycler *this,BigBlock *memoryBlocks)

{
  void **obj;
  size_t byteCount;
  void **base;
  BigBlock *blockp;
  size_t scanRootBytes;
  BigBlock *memoryBlocks_local;
  Recycler *this_local;
  
  blockp = (BigBlock *)0x0;
  for (base = (void **)memoryBlocks; base != (void **)0x0; base = (void **)*base) {
    obj = (void **)BigBlock::GetBytes((BigBlock *)base);
    blockp = (BigBlock *)((long)base[3] + (long)blockp);
    ScanMemory<false>(this,obj,(size_t)base[3]);
  }
  return (size_t)blockp;
}

Assistant:

size_t
Recycler::TryMarkBigBlockList(BigBlock * memoryBlocks)
{
    size_t scanRootBytes = 0;
    BigBlock *blockp = memoryBlocks;
    while (blockp != NULL)
    {
        void** base = (void**)blockp->GetBytes();
        size_t byteCount = blockp->currentByte;
        scanRootBytes +=  byteCount;
        this->ScanMemory<false>(base, byteCount);
        blockp = blockp->nextBigBlock;
    }
    return scanRootBytes;
}